

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

string * __thiscall project::get_linux_config_abi_cxx11_(project *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  iterator this_00;
  iterator system;
  reference pbVar4;
  long in_RSI;
  string *in_RDI;
  buildExport *in_stack_000000a0;
  string *in_stack_000000a8;
  project *in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lib;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *package;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  buildExport b;
  stringstream ss;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa18;
  buildExport *in_stack_fffffffffffffa20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa30;
  _Self local_518;
  _Self local_510;
  undefined1 local_508 [24];
  undefined1 *local_4f0;
  string *local_4e8;
  map_t *in_stack_fffffffffffffb20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb28;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  string *local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a0;
  undefined1 *local_498;
  string *local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_488;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_480;
  undefined1 *local_478;
  reference local_470;
  _Self local_468;
  _Self local_460;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_458;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  undefined4 local_434;
  allocator local_42d [20];
  allocator local_419;
  string local_418 [32];
  byte local_3f8;
  string local_380 [312];
  undefined1 auStack_248 [24];
  undefined1 auStack_230 [152];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  buildExport::buildExport(in_stack_fffffffffffffa20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"LINUX_MAKE",&local_419);
  get_export(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  if ((local_3f8 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",local_42d);
    std::allocator<char>::~allocator((allocator<char> *)local_42d);
    local_434 = 1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Using Linux Config");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    get_libraries((project *)in_stack_fffffffffffffb28._M_current,in_stack_fffffffffffffb20);
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&local_450);
    if (!bVar1) {
      std::operator<<(local_188,"\n");
      std::operator<<(local_188,"        include(FindPkgConfig)\n");
      std::operator<<(local_188,"        pkg_check_modules(JUCE_LIBS REQUIRED\n");
      std::operator<<(local_188,"            ");
      local_458 = &local_450;
      local_460._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffa18);
      local_468._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_fffffffffffffa18);
      while (bVar1 = std::operator!=(&local_460,&local_468), bVar1) {
        local_470 = std::
                    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)0x110330);
        poVar2 = std::operator<<(local_188,(string *)local_470);
        std::operator<<(poVar2," ");
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_460);
      }
      std::operator<<(local_188,"\n)\n");
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffa30);
    if ((!bVar1) ||
       (bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&local_450), !bVar1)) {
      std::operator<<(local_188,"\n");
      poVar2 = std::operator<<(local_188,"        target_include_directories(");
      poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
      std::operator<<(poVar2," PUBLIC\n");
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_450);
      if (!bVar1) {
        std::operator<<(local_188,"            ${JUCE_LIBS_INCLUDE_DIRS}\n");
      }
      local_478 = auStack_248;
      local_480._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa18);
      local_488 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa18);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa18), bVar1) {
        local_490 = (string *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_480);
        poVar2 = std::operator<<(local_188,"            ${CMAKE_SYSROOT}/");
        poVar2 = std::operator<<(poVar2,local_490);
        std::operator<<(poVar2,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_480);
      }
      std::operator<<(local_188,"        )\n");
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator<<(local_188,"\n");
      poVar2 = std::operator<<(local_188,"        target_compile_options(");
      poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
      poVar2 = std::operator<<(poVar2," PUBLIC ");
      poVar2 = std::operator<<(poVar2,local_380);
      std::operator<<(poVar2,")\n");
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffa30);
    if (!bVar1) {
      std::operator<<(local_188,"\n");
      poVar2 = std::operator<<(local_188,"        target_link_directories(");
      poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
      std::operator<<(poVar2," BEFORE PUBLIC\n");
      local_498 = auStack_230;
      local_4a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa18);
      local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa18);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa18), bVar1) {
        local_4b0 = (string *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_4a0);
        poVar2 = std::operator<<(local_188,"            ${CMAKE_SYSROOT}/");
        poVar2 = std::operator<<(poVar2,local_4b0);
        std::operator<<(poVar2,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_4a0);
      }
      std::operator<<(local_188,"        )\n");
    }
    get_libraries((project *)in_stack_fffffffffffffb28._M_current,in_stack_fffffffffffffb20);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffa30);
    if (((!bVar1) ||
        (bVar1 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(&local_450), !bVar1)) ||
       (bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&local_4c8), !bVar1)) {
      std::operator<<(local_188,"\n");
      poVar2 = std::operator<<(local_188,"        target_link_libraries(");
      poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 0x158));
      std::operator<<(poVar2,"\n");
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa18);
      system = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa18);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa20,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffa18), bVar1) {
        local_4e8 = (string *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&stack0xfffffffffffffb28);
        poVar2 = std::operator<<(local_188,"            ");
        poVar2 = std::operator<<(poVar2,local_4e8);
        std::operator<<(poVar2,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&stack0xfffffffffffffb28);
      }
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_450);
      if (!bVar1) {
        std::operator<<(local_188,"            ${JUCE_LIBS_LIBRARIES}\n");
      }
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_4c8);
      if (!bVar1) {
        std::operator<<(local_188,"            ");
        get_libraries((project *)this_00._M_current,(map_t *)system._M_current);
        local_4f0 = local_508;
        local_510._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffa18);
        local_518._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffa18);
        while (bVar1 = std::operator!=(&local_510,&local_518), bVar1) {
          pbVar4 = std::
                   _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x110a28);
          in_stack_fffffffffffffa20 = (buildExport *)std::operator<<(local_188,(string *)pbVar4);
          std::operator<<((ostream *)in_stack_fffffffffffffa20," ");
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_510);
        }
        local_434 = 10;
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x110a19);
        std::operator<<(local_188,"\n");
      }
      std::operator<<(local_188,"        )\n");
    }
    std::__cxx11::stringstream::str();
    local_434 = 1;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x110af5);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x110b02);
  }
  buildExport::~buildExport(in_stack_fffffffffffffa20);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string project::get_linux_config()
{
    std::stringstream ss;

    project::buildExport b;
    get_export("LINUX_MAKE", b);
    if(!b.valid)
    {
        return "";
    }
    std::cout << "Using Linux Config" << std::endl;

    auto packages = get_libraries(linuxPackages);
    if(!packages.empty())
    {
        ss << "\n";
        ss << "        include(FindPkgConfig)\n";
        ss << "        pkg_check_modules(JUCE_LIBS REQUIRED\n";
        ss << "            ";
        for(auto const& package : packages)
        {
            ss << package << " ";
        }
        ss << "\n)\n";
    }
    if(!b.debug.headerPath.empty() || !packages.empty())
    {
        ss << "\n";
        ss << "        target_include_directories(" << name << " PUBLIC\n";
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_INCLUDE_DIRS}\n";
        }
        for(auto const& path : b.debug.headerPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }
    if(!b.extraCompilerFlags.empty())
    {
        ss << "\n";
        ss << "        target_compile_options(" << name << " PUBLIC " << b.extraCompilerFlags << ")\n";
    }
    if(!b.debug.libraryPath.empty())
    {
        ss << "\n";
        ss << "        target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "            ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "        )\n";
    }

    auto libs = get_libraries(linuxLibs);
    if(!b.externalLibraries.empty() || !packages.empty() || !libs.empty())
    {
        ss << "\n";
        ss << "        target_link_libraries(" << name << "\n";
        for(auto const& library : b.externalLibraries)
        {
            ss << "            " << library << "\n";
        }
        if(!packages.empty())
        {
            ss << "            ${JUCE_LIBS_LIBRARIES}\n";
        }
        if(!libs.empty())
        {
            ss << "            ";
            for(auto const& lib : get_libraries(linuxLibs))
            {
                ss << lib << " ";
            }
            ss << "\n";
        }
        ss << "        )\n";
    }

    return ss.str();
}